

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O3

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::Struct_FieldsEntry_DoNotUse,_google::protobuf::Message,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
               *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  
  uVar5 = this->_has_bits_[0];
  if ((uVar5 & 1) == 0) {
    lVar6 = 0;
  }
  else {
    iVar1 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[0x14])(this);
    uVar5 = *(uint *)(CONCAT44(extraout_var,iVar1) + 8);
    uVar4 = uVar5 | 1;
    iVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    lVar6 = (long)(int)((iVar1 * 9 + 0x49U >> 6) + uVar5) + 1;
    uVar5 = this->_has_bits_[0];
  }
  if ((uVar5 & 2) == 0) {
    lVar3 = 0;
  }
  else {
    iVar1 = (*(this->super_Message).super_MessageLite._vptr_MessageLite[0x15])(this);
    sVar2 = Value::ByteSizeLong((Value *)CONCAT44(extraout_var_00,iVar1));
    uVar5 = (uint)sVar2 | 1;
    iVar1 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    lVar3 = sVar2 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  return lVar3 + lVar6;
}

Assistant:

size_t ByteSizeLong() const override {
    size_t size = 0;
    size += has_key() ? kTagSize +
                            static_cast<size_t>(KeyTypeHandler::ByteSize(key()))
                      : 0;
    size += has_value()
                ? kTagSize +
                      static_cast<size_t>(ValueTypeHandler::ByteSize(value()))
                : 0;
    return size;
  }